

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

void xmlParserAddNodeInfo(xmlParserCtxtPtr ctxt,xmlParserNodeInfoPtr info)

{
  unsigned_long *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  xmlNodePtr node;
  ulong uVar4;
  uint uVar5;
  _xmlNode *p_Var6;
  unsigned_long uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  unsigned_long uVar11;
  xmlParserNodeInfo *pxVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  unsigned_long uVar17;
  
  if (info != (xmlParserNodeInfoPtr)0x0 && ctxt != (xmlParserCtxtPtr)0x0) {
    node = info->node;
    uVar11 = xmlParserFindNodeInfoIndex(&ctxt->node_seq,node);
    uVar13 = (ctxt->node_seq).length;
    if (((uVar11 < uVar13) &&
        (pxVar12 = (ctxt->node_seq).buffer, pxVar12 != (xmlParserNodeInfo *)0x0)) &&
       (pxVar12[uVar11].node == node)) {
      pxVar12 = pxVar12 + uVar11;
      pxVar12->end_line = info->end_line;
      p_Var6 = info->node;
      uVar11 = info->begin_pos;
      uVar17 = info->end_pos;
      pxVar12->begin_line = info->begin_line;
      pxVar12->end_pos = uVar17;
      pxVar12->node = p_Var6;
      pxVar12->begin_pos = uVar11;
      return;
    }
    uVar4 = (ctxt->node_seq).maximum;
    if (uVar4 < uVar13 + 1) {
      uVar14 = (uint)uVar4;
      if ((int)uVar14 < 1) {
        uVar17 = 4;
      }
      else {
        if (999999999 < uVar14) goto LAB_001447a9;
        uVar16 = uVar14 + 1 >> 1;
        uVar5 = uVar16 + uVar14;
        if (1000000000 - uVar16 < uVar14) {
          uVar5 = 1000000000;
        }
        uVar17 = (unsigned_long)uVar5;
      }
      pxVar12 = (xmlParserNodeInfo *)(*xmlRealloc)((ctxt->node_seq).buffer,uVar17 * 0x28);
      if (pxVar12 == (xmlParserNodeInfo *)0x0) {
LAB_001447a9:
        xmlCtxtErrMemory(ctxt);
        return;
      }
      (ctxt->node_seq).buffer = pxVar12;
      (ctxt->node_seq).maximum = uVar17;
      uVar13 = (ctxt->node_seq).length;
    }
    if (uVar11 != uVar13) {
      lVar15 = uVar13 * 0x28;
      for (; uVar11 < uVar13; uVar13 = uVar13 - 1) {
        pxVar12 = (ctxt->node_seq).buffer;
        *(undefined8 *)((long)&pxVar12->end_line + lVar15) =
             *(undefined8 *)((long)pxVar12 + lVar15 + -8);
        puVar2 = (undefined8 *)((long)&pxVar12[-1].node + lVar15);
        uVar8 = *puVar2;
        uVar9 = puVar2[1];
        puVar2 = (undefined8 *)((long)pxVar12 + lVar15 + -0x18);
        uVar10 = puVar2[1];
        puVar3 = (undefined8 *)((long)&pxVar12->begin_line + lVar15);
        *puVar3 = *puVar2;
        puVar3[1] = uVar10;
        puVar2 = (undefined8 *)((long)&pxVar12->node + lVar15);
        *puVar2 = uVar8;
        puVar2[1] = uVar9;
        lVar15 = lVar15 + -0x28;
      }
    }
    pxVar12 = (ctxt->node_seq).buffer;
    pxVar12[uVar11].end_line = info->end_line;
    p_Var6 = info->node;
    uVar17 = info->begin_pos;
    uVar7 = info->end_pos;
    pxVar12[uVar11].begin_line = info->begin_line;
    (&pxVar12[uVar11].begin_line)[1] = uVar7;
    pxVar12[uVar11].node = p_Var6;
    pxVar12[uVar11].begin_pos = uVar17;
    puVar1 = &(ctxt->node_seq).length;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void
xmlParserAddNodeInfo(xmlParserCtxtPtr ctxt,
                     xmlParserNodeInfoPtr info)
{
    unsigned long pos;

    if ((ctxt == NULL) || (info == NULL)) return;

    /* Find pos and check to see if node is already in the sequence */
    pos = xmlParserFindNodeInfoIndex(&ctxt->node_seq, (xmlNodePtr)
                                     info->node);

    if ((pos < ctxt->node_seq.length) &&
        (ctxt->node_seq.buffer != NULL) &&
        (ctxt->node_seq.buffer[pos].node == info->node)) {
        ctxt->node_seq.buffer[pos] = *info;
    }

    /* Otherwise, we need to add new node to buffer */
    else {
        if (ctxt->node_seq.length + 1 > ctxt->node_seq.maximum) {
            xmlParserNodeInfo *tmp;
            int newSize;

            newSize = xmlGrowCapacity(ctxt->node_seq.maximum, sizeof(tmp[0]),
                                      4, XML_MAX_ITEMS);
            if (newSize < 0) {
		xmlCtxtErrMemory(ctxt);
                return;
            }
            tmp = xmlRealloc(ctxt->node_seq.buffer, newSize * sizeof(tmp[0]));
            if (tmp == NULL) {
		xmlCtxtErrMemory(ctxt);
                return;
            }
            ctxt->node_seq.buffer = tmp;
            ctxt->node_seq.maximum = newSize;
        }

        /* If position is not at end, move elements out of the way */
        if (pos != ctxt->node_seq.length) {
            unsigned long i;

            for (i = ctxt->node_seq.length; i > pos; i--)
                ctxt->node_seq.buffer[i] = ctxt->node_seq.buffer[i - 1];
        }

        /* Copy element and increase length */
        ctxt->node_seq.buffer[pos] = *info;
        ctxt->node_seq.length++;
    }
}